

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall
wabt::WastParser::ParsePlainInstr
          (WastParser *this,unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *out_expr)

{
  Token *pTVar1;
  Location loc_00;
  Location loc_01;
  Location loc_02;
  Location loc_03;
  Location loc_04;
  Location loc_05;
  Location loc_06;
  Location loc_07;
  Location loc_08;
  Location loc_09;
  Location loc_10;
  Location loc_11;
  Location loc_12;
  Location loc_13;
  Location loc_14;
  Location loc_15;
  Location loc_16;
  Location loc_17;
  Location loc_18;
  Location loc_19;
  Location loc_20;
  Location loc_21;
  v128 val;
  undefined8 uVar2;
  bool bVar3;
  TokenType TVar4;
  Result RVar5;
  Opcode OVar6;
  pointer pEVar7;
  pointer pBVar8;
  reference rhs;
  pointer pCVar9;
  pointer pRVar10;
  ConstExpr *this_00;
  SimdLaneOpExpr *this_01;
  SimdShuffleOpExpr *this_02;
  undefined1 local_1428 [8];
  Const const__1;
  Token token_10;
  uint64_t local_1398;
  uint64_t lane_idx;
  Token token_9;
  undefined1 local_1338 [8];
  Token token_8;
  undefined1 local_1268 [8];
  Token token_7;
  undefined1 local_1198 [8];
  Token token_6;
  undefined1 local_10c8 [8];
  Token token_5;
  undefined1 local_ff8 [8];
  Token token_4;
  undefined1 local_f28 [8];
  Token token_3;
  undefined1 local_e60 [8];
  Token token_2;
  Token local_d98;
  char *local_d48;
  char *local_d40;
  size_type local_d38;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_d30;
  Enum local_d24;
  Token local_d20;
  char *local_cd0;
  char *local_cc8;
  size_type local_cc0;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_cb8;
  Enum local_cac;
  Token local_ca8;
  Token local_c58;
  Token local_c08;
  Token local_bb8;
  char *local_b68;
  char *local_b60;
  size_type local_b58;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_b50;
  Enum local_b44;
  Token local_b40;
  char *local_af0;
  char *local_ae8;
  size_type local_ae0;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_ad8;
  Enum local_acc;
  Token local_ac8;
  Token local_a78;
  Token local_a28;
  Enum local_9d4;
  undefined1 local_9d0 [8];
  Token token_1;
  Token local_978;
  Enum local_928;
  undefined1 local_921;
  Token local_920;
  Enum local_8d0;
  Enum local_8cc;
  undefined1 local_8c8 [8];
  Token token;
  undefined1 local_870 [8];
  Const const_;
  Token local_7b8;
  char *local_768;
  char *pcStack_760;
  size_type local_758;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 aStack_750;
  Enum local_73c;
  char *local_738;
  char *local_730;
  size_type local_728;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_720;
  Enum local_714;
  Token local_710;
  char *local_6c0;
  char *local_6b8;
  size_type local_6b0;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_6a8;
  Enum local_69c;
  Token local_698;
  char *local_648;
  char *local_640;
  size_type local_638;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_630;
  Enum local_624;
  Token local_620;
  char *local_5d0;
  char *local_5c8;
  size_type local_5c0;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_5b8;
  Enum local_5ac;
  Token local_5a8;
  char *local_558;
  char *local_550;
  size_type local_548;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_540;
  Enum local_534;
  Token local_530;
  Enum local_4e0;
  Enum local_4dc;
  unique_ptr<wabt::ReturnCallIndirectExpr,_std::default_delete<wabt::ReturnCallIndirectExpr>_>
  local_4d8;
  unique_ptr<wabt::ReturnCallIndirectExpr,_std::default_delete<wabt::ReturnCallIndirectExpr>_>
  expr_2;
  Token local_458;
  Enum local_408;
  Enum local_404;
  unique_ptr<wabt::CallIndirectExpr,_std::default_delete<wabt::CallIndirectExpr>_> local_400;
  unique_ptr<wabt::CallIndirectExpr,_std::default_delete<wabt::CallIndirectExpr>_> expr_1;
  Token local_380;
  Token local_330;
  int local_2e0;
  Enum local_2dc;
  unique_ptr<wabt::BrTableExpr,_std::default_delete<wabt::BrTableExpr>_> local_2d8;
  unique_ptr<wabt::BrTableExpr,_std::default_delete<wabt::BrTableExpr>_> expr;
  Token local_258;
  char *local_208;
  char *local_200;
  size_type local_1f8;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_1f0;
  Enum local_1e4;
  Token local_1e0;
  Token local_190;
  Token local_140;
  Token local_f0;
  Token local_90;
  undefined1 auStack_40 [8];
  Location loc;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *out_expr_local;
  WastParser *this_local;
  
  loc.field_1._8_8_ = out_expr;
  GetLocation((Location *)auStack_40,this);
  TVar4 = Peek(this,0);
  uVar2 = loc.field_1._8_8_;
  switch(TVar4) {
  case AtomicLoad:
    Consume((Token *)local_ff8,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_ff8);
    Token::Token((Token *)((long)&token_5.field_2.literal_.text.field_2 + 8),(Token *)local_ff8);
    loc_18.filename.size_ = (size_type)loc.filename.data_;
    loc_18.filename.data_ = (char *)auStack_40;
    loc_18.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename.size_;
    loc_18.field_1._8_8_ = loc.field_1.field_1.offset;
    RVar5 = ParsePlainLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)0>>
                      (this,loc_18,(Token *)((long)&token_5.field_2.literal_.text.field_2 + 8),
                       (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)loc.field_1._8_8_
                      );
    bVar3 = Failed(RVar5);
    Token::~Token((Token *)((long)&token_5.field_2.literal_.text.field_2 + 8));
    if (bVar3) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_2e0 = 1;
    }
    else {
      local_2e0 = 2;
    }
    Token::~Token((Token *)local_ff8);
    goto joined_r0x016e050b;
  case AtomicRmw:
    Consume((Token *)local_1198,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_1198);
    Token::Token((Token *)((long)&token_7.field_2.literal_.text.field_2 + 8),(Token *)local_1198);
    loc_20.filename.size_ = (size_type)loc.filename.data_;
    loc_20.filename.data_ = (char *)auStack_40;
    loc_20.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename.size_;
    loc_20.field_1._8_8_ = loc.field_1.field_1.offset;
    RVar5 = ParsePlainLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)1>>
                      (this,loc_20,(Token *)((long)&token_7.field_2.literal_.text.field_2 + 8),
                       (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)loc.field_1._8_8_
                      );
    bVar3 = Failed(RVar5);
    Token::~Token((Token *)((long)&token_7.field_2.literal_.text.field_2 + 8));
    if (bVar3) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_2e0 = 1;
    }
    else {
      local_2e0 = 2;
    }
    Token::~Token((Token *)local_1198);
    goto joined_r0x016e050b;
  case AtomicRmwCmpxchg:
    Consume((Token *)local_1268,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_1268);
    Token::Token((Token *)((long)&token_8.field_2.literal_.text.field_2 + 8),(Token *)local_1268);
    loc_21.filename.size_ = (size_type)loc.filename.data_;
    loc_21.filename.data_ = (char *)auStack_40;
    loc_21.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename.size_;
    loc_21.field_1._8_8_ = loc.field_1.field_1.offset;
    RVar5 = ParsePlainLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)2>>
                      (this,loc_21,(Token *)((long)&token_8.field_2.literal_.text.field_2 + 8),
                       (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)loc.field_1._8_8_
                      );
    bVar3 = Failed(RVar5);
    Token::~Token((Token *)((long)&token_8.field_2.literal_.text.field_2 + 8));
    if (bVar3) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_2e0 = 1;
    }
    else {
      local_2e0 = 2;
    }
    Token::~Token((Token *)local_1268);
    goto joined_r0x016e050b;
  case AtomicStore:
    Consume((Token *)local_10c8,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_10c8);
    Token::Token((Token *)((long)&token_6.field_2.literal_.text.field_2 + 8),(Token *)local_10c8);
    loc_19.filename.size_ = (size_type)loc.filename.data_;
    loc_19.filename.data_ = (char *)auStack_40;
    loc_19.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename.size_;
    loc_19.field_1._8_8_ = loc.field_1.field_1.offset;
    RVar5 = ParsePlainLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)3>>
                      (this,loc_19,(Token *)((long)&token_6.field_2.literal_.text.field_2 + 8),
                       (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)loc.field_1._8_8_
                      );
    bVar3 = Failed(RVar5);
    Token::~Token((Token *)((long)&token_6.field_2.literal_.text.field_2 + 8));
    if (bVar3) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_2e0 = 1;
    }
    else {
      local_2e0 = 2;
    }
    Token::~Token((Token *)local_10c8);
    goto joined_r0x016e050b;
  case AtomicWait:
    Consume((Token *)local_f28,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_f28);
    Token::Token((Token *)((long)&token_4.field_2.literal_.text.field_2 + 8),(Token *)local_f28);
    loc_17.filename.size_ = (size_type)loc.filename.data_;
    loc_17.filename.data_ = (char *)auStack_40;
    loc_17.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename.size_;
    loc_17.field_1._8_8_ = loc.field_1.field_1.offset;
    RVar5 = ParsePlainLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)4>>
                      (this,loc_17,(Token *)((long)&token_4.field_2.literal_.text.field_2 + 8),
                       (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)loc.field_1._8_8_
                      );
    bVar3 = Failed(RVar5);
    Token::~Token((Token *)((long)&token_4.field_2.literal_.text.field_2 + 8));
    if (bVar3) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_2e0 = 1;
    }
    else {
      local_2e0 = 2;
    }
    Token::~Token((Token *)local_f28);
    goto joined_r0x016e050b;
  case AtomicWake:
    Consume((Token *)local_e60,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_e60);
    Token::Token((Token *)((long)&token_3.field_2.literal_.text.field_2 + 8),(Token *)local_e60);
    loc_16.filename.size_ = (size_type)loc.filename.data_;
    loc_16.filename.data_ = (char *)auStack_40;
    loc_16.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename.size_;
    loc_16.field_1._8_8_ = loc.field_1.field_1.offset;
    RVar5 = ParsePlainLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)5>>
                      (this,loc_16,(Token *)((long)&token_3.field_2.literal_.text.field_2 + 8),
                       (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)loc.field_1._8_8_
                      );
    bVar3 = Failed(RVar5);
    Token::~Token((Token *)((long)&token_3.field_2.literal_.text.field_2 + 8));
    if (bVar3) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_2e0 = 1;
    }
    else {
      local_2e0 = 2;
    }
    Token::~Token((Token *)local_e60);
    goto joined_r0x016e050b;
  case Binary:
    pEVar7 = (pointer)operator_new(0x40);
    local_921 = 1;
    Consume(&local_920,this);
    local_8d0 = (Enum)Token::opcode(&local_920);
    OpcodeExpr<(wabt::ExprType)6>::OpcodeExpr
              ((OpcodeExpr<(wabt::ExprType)6> *)pEVar7,(Opcode)local_8d0,(Location *)auStack_40);
    local_921 = 0;
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
              ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)uVar2,pEVar7);
    Token::~Token(&local_920);
    break;
  default:
    __assert_fail("!\"ParsePlainInstr should only be called when IsPlainInstr() is true\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/wast-parser.cc"
                  ,0x648,"Result wabt::WastParser::ParsePlainInstr(std::unique_ptr<Expr> *)");
  case Br:
    Consume(&local_1e0,this);
    Token::~Token(&local_1e0);
    local_208 = (char *)auStack_40;
    local_200 = loc.filename.data_;
    local_1f8 = loc.filename.size_;
    local_1f0.offset = (size_t)loc.field_1.field_1.offset;
    loc_00.filename.size_ = (size_type)loc.filename.data_;
    loc_00.filename.data_ = (char *)auStack_40;
    loc_00.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename.size_;
    loc_00.field_1._8_8_ = loc.field_1.field_1.offset;
    local_1e4 = (Enum)ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)8>>
                                (this,loc_00,
                                 (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                 loc.field_1._8_8_);
    bVar3 = Failed((Result)local_1e4);
    if (bVar3) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case BrIf:
    Consume(&local_258,this);
    Token::~Token(&local_258);
    loc_01.filename.size_ = (size_type)loc.filename.data_;
    loc_01.filename.data_ = (char *)auStack_40;
    loc_01.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename.size_;
    loc_01.field_1._8_8_ = loc.field_1.field_1.offset;
    RVar5 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)9>>
                      (this,loc_01,
                       (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)loc.field_1._8_8_
                      );
    bVar3 = Failed(RVar5);
    if (bVar3) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case BrTable:
    Consume((Token *)&expr,this);
    Token::~Token((Token *)&expr);
    MakeUnique<wabt::BrTableExpr,wabt::Location&>((wabt *)&local_2d8,(Location *)auStack_40);
    pBVar8 = std::unique_ptr<wabt::BrTableExpr,_std::default_delete<wabt::BrTableExpr>_>::operator->
                       (&local_2d8);
    local_2dc = (Enum)ParseVarList(this,&pBVar8->targets);
    bVar3 = Failed((Result)local_2dc);
    if (bVar3) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_2e0 = 1;
    }
    else {
      pBVar8 = std::unique_ptr<wabt::BrTableExpr,_std::default_delete<wabt::BrTableExpr>_>::
               operator->(&local_2d8);
      rhs = std::vector<wabt::Var,_std::allocator<wabt::Var>_>::back(&pBVar8->targets);
      pBVar8 = std::unique_ptr<wabt::BrTableExpr,_std::default_delete<wabt::BrTableExpr>_>::
               operator->(&local_2d8);
      Var::operator=(&pBVar8->default_target,rhs);
      pBVar8 = std::unique_ptr<wabt::BrTableExpr,_std::default_delete<wabt::BrTableExpr>_>::
               operator->(&local_2d8);
      std::vector<wabt::Var,_std::allocator<wabt::Var>_>::pop_back(&pBVar8->targets);
      std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::operator=
                ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)loc.field_1._8_8_,
                 &local_2d8);
      local_2e0 = 2;
    }
    std::unique_ptr<wabt::BrTableExpr,_std::default_delete<wabt::BrTableExpr>_>::~unique_ptr
              (&local_2d8);
    goto joined_r0x016e050b;
  case Call:
    Consume(&local_380,this);
    Token::~Token(&local_380);
    loc_02.filename.size_ = (size_type)loc.filename.data_;
    loc_02.filename.data_ = (char *)auStack_40;
    loc_02.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename.size_;
    loc_02.field_1._8_8_ = loc.field_1.field_1.offset;
    RVar5 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)11>>
                      (this,loc_02,
                       (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)loc.field_1._8_8_
                      );
    bVar3 = Failed(RVar5);
    if (bVar3) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case CallIndirect:
    Consume((Token *)&expr_1,this);
    Token::~Token((Token *)&expr_1);
    MakeUnique<wabt::CallIndirectExpr,wabt::Location&>((wabt *)&local_400,(Location *)auStack_40);
    pCVar9 = std::unique_ptr<wabt::CallIndirectExpr,_std::default_delete<wabt::CallIndirectExpr>_>::
             operator->(&local_400);
    local_404 = (Enum)ParseTypeUseOpt(this,&pCVar9->decl);
    bVar3 = Failed((Result)local_404);
    if (bVar3) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_2e0 = 1;
    }
    else {
      pCVar9 = std::unique_ptr<wabt::CallIndirectExpr,_std::default_delete<wabt::CallIndirectExpr>_>
               ::operator->(&local_400);
      local_408 = (Enum)ParseUnboundFuncSignature(this,&(pCVar9->decl).sig);
      bVar3 = Failed((Result)local_408);
      if (bVar3) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        local_2e0 = 1;
      }
      else {
        std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::operator=
                  ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)loc.field_1._8_8_,
                   &local_400);
        local_2e0 = 2;
      }
    }
    std::unique_ptr<wabt::CallIndirectExpr,_std::default_delete<wabt::CallIndirectExpr>_>::
    ~unique_ptr(&local_400);
    goto joined_r0x016e050b;
  case Compare:
    pEVar7 = (pointer)operator_new(0x40);
    token_1.field_2._39_1_ = 1;
    Consume(&local_978,this);
    local_928 = (Enum)Token::opcode(&local_978);
    OpcodeExpr<(wabt::ExprType)13>::OpcodeExpr
              ((OpcodeExpr<(wabt::ExprType)13> *)pEVar7,(Opcode)local_928,(Location *)auStack_40);
    token_1.field_2._39_1_ = 0;
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
              ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)uVar2,pEVar7);
    Token::~Token(&local_978);
    break;
  case Const:
    Const::Const((Const *)local_870);
    token.field_2._36_4_ = ParseConst(this,(Const *)local_870);
    bVar3 = Failed((Result)token.field_2._36_4_);
    uVar2 = loc.field_1._8_8_;
    if (bVar3) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    this_00 = (ConstExpr *)operator_new(0x78);
    ConstExpr::ConstExpr(this_00,(Const *)local_870,(Location *)auStack_40);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
              ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)uVar2,(pointer)this_00);
    break;
  case Convert:
    Consume((Token *)local_9d0,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_9d0);
    uVar2 = loc.field_1._8_8_;
    pEVar7 = (pointer)operator_new(0x40);
    local_9d4 = (Enum)Token::opcode((Token *)local_9d0);
    OpcodeExpr<(wabt::ExprType)15>::OpcodeExpr
              ((OpcodeExpr<(wabt::ExprType)15> *)pEVar7,(Opcode)local_9d4,(Location *)auStack_40);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
              ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)uVar2,pEVar7);
    local_2e0 = 2;
    Token::~Token((Token *)local_9d0);
    break;
  case Drop:
    Consume(&local_140,this);
    Token::~Token(&local_140);
    uVar2 = loc.field_1._8_8_;
    pEVar7 = (pointer)operator_new(0x40);
    ExprMixin<(wabt::ExprType)16>::ExprMixin
              ((ExprMixin<(wabt::ExprType)16> *)pEVar7,(Location *)auStack_40);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
              ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)uVar2,pEVar7);
    break;
  case GetGlobal:
    Consume(&local_698,this);
    Token::~Token(&local_698);
    local_6c0 = (char *)auStack_40;
    local_6b8 = loc.filename.data_;
    local_6b0 = loc.filename.size_;
    local_6a8.offset = (size_t)loc.field_1.field_1.offset;
    loc_07.filename.size_ = (size_type)loc.filename.data_;
    loc_07.filename.data_ = (char *)auStack_40;
    loc_07.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename.size_;
    loc_07.field_1._8_8_ = loc.field_1.field_1.offset;
    local_69c = (Enum)ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)17>>
                                (this,loc_07,
                                 (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                 loc.field_1._8_8_);
    bVar3 = Failed((Result)local_69c);
    if (bVar3) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case GetLocal:
    Consume(&local_530,this);
    Token::~Token(&local_530);
    local_558 = (char *)auStack_40;
    local_550 = loc.filename.data_;
    local_548 = loc.filename.size_;
    local_540.offset = (size_t)loc.field_1.field_1.offset;
    loc_04.filename.size_ = (size_type)loc.filename.data_;
    loc_04.filename.data_ = (char *)auStack_40;
    loc_04.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename.size_;
    loc_04.field_1._8_8_ = loc.field_1.field_1.offset;
    local_534 = (Enum)ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)18>>
                                (this,loc_04,
                                 (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                 loc.field_1._8_8_);
    bVar3 = Failed((Result)local_534);
    if (bVar3) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case Load:
    local_758 = loc.filename.size_;
    aStack_750.offset = (size_t)loc.field_1.field_1.offset;
    local_768 = (char *)auStack_40;
    pcStack_760 = loc.filename.data_;
    Consume(&local_7b8,this);
    loc_09.filename.size_ = (size_type)pcStack_760;
    loc_09.filename.data_ = local_768;
    loc_09.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_758;
    loc_09.field_1._8_8_ = aStack_750.offset;
    local_73c = (Enum)ParsePlainLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)21>>
                                (this,loc_09,&local_7b8,
                                 (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                 loc.field_1._8_8_);
    bVar3 = Failed((Result)local_73c);
    Token::~Token(&local_7b8);
    if (bVar3) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case MemoryCopy:
    Consume(&local_a28,this);
    ErrorUnlessOpcodeEnabled(this,&local_a28);
    Token::~Token(&local_a28);
    uVar2 = loc.field_1._8_8_;
    pEVar7 = (pointer)operator_new(0x40);
    ExprMixin<(wabt::ExprType)23>::ExprMixin
              ((ExprMixin<(wabt::ExprType)23> *)pEVar7,(Location *)auStack_40);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
              ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)uVar2,pEVar7);
    break;
  case MemoryDrop:
    Consume(&local_ac8,this);
    ErrorUnlessOpcodeEnabled(this,&local_ac8);
    Token::~Token(&local_ac8);
    local_af0 = (char *)auStack_40;
    local_ae8 = loc.filename.data_;
    local_ae0 = loc.filename.size_;
    local_ad8.offset = (size_t)loc.field_1.field_1.offset;
    loc_11.filename.size_ = (size_type)loc.filename.data_;
    loc_11.filename.data_ = (char *)auStack_40;
    loc_11.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename.size_;
    loc_11.field_1._8_8_ = loc.field_1.field_1.offset;
    local_acc = (Enum)ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)24>>
                                (this,loc_11,
                                 (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                 loc.field_1._8_8_);
    bVar3 = Failed((Result)local_acc);
    if (bVar3) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case MemoryFill:
    Consume(&local_a78,this);
    ErrorUnlessOpcodeEnabled(this,&local_a78);
    Token::~Token(&local_a78);
    uVar2 = loc.field_1._8_8_;
    pEVar7 = (pointer)operator_new(0x40);
    ExprMixin<(wabt::ExprType)25>::ExprMixin
              ((ExprMixin<(wabt::ExprType)25> *)pEVar7,(Location *)auStack_40);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
              ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)uVar2,pEVar7);
    break;
  case MemoryGrow:
    Consume(&local_c08,this);
    Token::~Token(&local_c08);
    uVar2 = loc.field_1._8_8_;
    pEVar7 = (pointer)operator_new(0x40);
    ExprMixin<(wabt::ExprType)26>::ExprMixin
              ((ExprMixin<(wabt::ExprType)26> *)pEVar7,(Location *)auStack_40);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
              ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)uVar2,pEVar7);
    break;
  case MemoryInit:
    Consume(&local_b40,this);
    ErrorUnlessOpcodeEnabled(this,&local_b40);
    Token::~Token(&local_b40);
    local_b68 = (char *)auStack_40;
    local_b60 = loc.filename.data_;
    local_b58 = loc.filename.size_;
    local_b50.offset = (size_t)loc.field_1.field_1.offset;
    loc_12.filename.size_ = (size_type)loc.filename.data_;
    loc_12.filename.data_ = (char *)auStack_40;
    loc_12.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename.size_;
    loc_12.field_1._8_8_ = loc.field_1.field_1.offset;
    local_b44 = (Enum)ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)27>>
                                (this,loc_12,
                                 (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                 loc.field_1._8_8_);
    bVar3 = Failed((Result)local_b44);
    if (bVar3) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case MemorySize:
    Consume(&local_bb8,this);
    Token::~Token(&local_bb8);
    uVar2 = loc.field_1._8_8_;
    pEVar7 = (pointer)operator_new(0x40);
    ExprMixin<(wabt::ExprType)28>::ExprMixin
              ((ExprMixin<(wabt::ExprType)28> *)pEVar7,(Location *)auStack_40);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
              ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)uVar2,pEVar7);
    break;
  case TableCopy:
    Consume(&local_c58,this);
    ErrorUnlessOpcodeEnabled(this,&local_c58);
    Token::~Token(&local_c58);
    uVar2 = loc.field_1._8_8_;
    pEVar7 = (pointer)operator_new(0x40);
    ExprMixin<(wabt::ExprType)41>::ExprMixin
              ((ExprMixin<(wabt::ExprType)41> *)pEVar7,(Location *)auStack_40);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
              ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)uVar2,pEVar7);
    break;
  case TableDrop:
    Consume(&local_ca8,this);
    ErrorUnlessOpcodeEnabled(this,&local_ca8);
    Token::~Token(&local_ca8);
    local_cd0 = (char *)auStack_40;
    local_cc8 = loc.filename.data_;
    local_cc0 = loc.filename.size_;
    local_cb8.offset = (size_t)loc.field_1.field_1.offset;
    loc_13.filename.size_ = (size_type)loc.filename.data_;
    loc_13.filename.data_ = (char *)auStack_40;
    loc_13.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename.size_;
    loc_13.field_1._8_8_ = loc.field_1.field_1.offset;
    local_cac = (Enum)ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)42>>
                                (this,loc_13,
                                 (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                 loc.field_1._8_8_);
    bVar3 = Failed((Result)local_cac);
    if (bVar3) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case TableInit:
    Consume(&local_d20,this);
    ErrorUnlessOpcodeEnabled(this,&local_d20);
    Token::~Token(&local_d20);
    local_d48 = (char *)auStack_40;
    local_d40 = loc.filename.data_;
    local_d38 = loc.filename.size_;
    local_d30.offset = (size_t)loc.field_1.field_1.offset;
    loc_14.filename.size_ = (size_type)loc.filename.data_;
    loc_14.filename.data_ = (char *)auStack_40;
    loc_14.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename.size_;
    loc_14.field_1._8_8_ = loc.field_1.field_1.offset;
    local_d24 = (Enum)ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)40>>
                                (this,loc_14,
                                 (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                 loc.field_1._8_8_);
    bVar3 = Failed((Result)local_d24);
    if (bVar3) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case Nop:
    Consume(&local_f0,this);
    Token::~Token(&local_f0);
    uVar2 = loc.field_1._8_8_;
    pEVar7 = (pointer)operator_new(0x40);
    ExprMixin<(wabt::ExprType)29>::ExprMixin
              ((ExprMixin<(wabt::ExprType)29> *)pEVar7,(Location *)auStack_40);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
              ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)uVar2,pEVar7);
    break;
  case Rethrow:
    pTVar1 = (Token *)((long)&token_2.field_2.literal_.text.field_2 + 8);
    Consume(pTVar1,this);
    ErrorUnlessOpcodeEnabled(this,pTVar1);
    Token::~Token((Token *)((long)&token_2.field_2.literal_.text.field_2 + 8));
    uVar2 = loc.field_1._8_8_;
    pEVar7 = (pointer)operator_new(0x40);
    ExprMixin<(wabt::ExprType)30>::ExprMixin
              ((ExprMixin<(wabt::ExprType)30> *)pEVar7,(Location *)auStack_40);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
              ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)uVar2,pEVar7);
    break;
  case Return:
    Consume(&local_330,this);
    Token::~Token(&local_330);
    uVar2 = loc.field_1._8_8_;
    pEVar7 = (pointer)operator_new(0x40);
    ExprMixin<(wabt::ExprType)31>::ExprMixin
              ((ExprMixin<(wabt::ExprType)31> *)pEVar7,(Location *)auStack_40);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
              ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)uVar2,pEVar7);
    break;
  case ReturnCall:
    Consume(&local_458,this);
    ErrorUnlessOpcodeEnabled(this,&local_458);
    Token::~Token(&local_458);
    loc_03.filename.size_ = (size_type)loc.filename.data_;
    loc_03.filename.data_ = (char *)auStack_40;
    loc_03.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename.size_;
    loc_03.field_1._8_8_ = loc.field_1.field_1.offset;
    RVar5 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)32>>
                      (this,loc_03,
                       (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)loc.field_1._8_8_
                      );
    bVar3 = Failed(RVar5);
    if (bVar3) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case ReturnCallIndirect:
    Consume((Token *)&expr_2,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)&expr_2);
    Token::~Token((Token *)&expr_2);
    MakeUnique<wabt::ReturnCallIndirectExpr,wabt::Location&>
              ((wabt *)&local_4d8,(Location *)auStack_40);
    pRVar10 = std::
              unique_ptr<wabt::ReturnCallIndirectExpr,_std::default_delete<wabt::ReturnCallIndirectExpr>_>
              ::operator->(&local_4d8);
    local_4dc = (Enum)ParseTypeUseOpt(this,&pRVar10->decl);
    bVar3 = Failed((Result)local_4dc);
    if (bVar3) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_2e0 = 1;
    }
    else {
      pRVar10 = std::
                unique_ptr<wabt::ReturnCallIndirectExpr,_std::default_delete<wabt::ReturnCallIndirectExpr>_>
                ::operator->(&local_4d8);
      local_4e0 = (Enum)ParseUnboundFuncSignature(this,&(pRVar10->decl).sig);
      bVar3 = Failed((Result)local_4e0);
      if (bVar3) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        local_2e0 = 1;
      }
      else {
        std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::operator=
                  ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)loc.field_1._8_8_,
                   &local_4d8);
        local_2e0 = 2;
      }
    }
    std::
    unique_ptr<wabt::ReturnCallIndirectExpr,_std::default_delete<wabt::ReturnCallIndirectExpr>_>::
    ~unique_ptr(&local_4d8);
    goto joined_r0x016e050b;
  case Select:
    Consume(&local_190,this);
    Token::~Token(&local_190);
    uVar2 = loc.field_1._8_8_;
    pEVar7 = (pointer)operator_new(0x40);
    ExprMixin<(wabt::ExprType)34>::ExprMixin
              ((ExprMixin<(wabt::ExprType)34> *)pEVar7,(Location *)auStack_40);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
              ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)uVar2,pEVar7);
    break;
  case SetGlobal:
    Consume(&local_710,this);
    Token::~Token(&local_710);
    local_738 = (char *)auStack_40;
    local_730 = loc.filename.data_;
    local_728 = loc.filename.size_;
    local_720.offset = (size_t)loc.field_1.field_1.offset;
    loc_08.filename.size_ = (size_type)loc.filename.data_;
    loc_08.filename.data_ = (char *)auStack_40;
    loc_08.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename.size_;
    loc_08.field_1._8_8_ = loc.field_1.field_1.offset;
    local_714 = (Enum)ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)35>>
                                (this,loc_08,
                                 (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                 loc.field_1._8_8_);
    bVar3 = Failed((Result)local_714);
    if (bVar3) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case SetLocal:
    Consume(&local_5a8,this);
    Token::~Token(&local_5a8);
    local_5d0 = (char *)auStack_40;
    local_5c8 = loc.filename.data_;
    local_5c0 = loc.filename.size_;
    local_5b8.offset = (size_t)loc.field_1.field_1.offset;
    loc_05.filename.size_ = (size_type)loc.filename.data_;
    loc_05.filename.data_ = (char *)auStack_40;
    loc_05.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename.size_;
    loc_05.field_1._8_8_ = loc.field_1.field_1.offset;
    local_5ac = (Enum)ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)36>>
                                (this,loc_05,
                                 (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                 loc.field_1._8_8_);
    bVar3 = Failed((Result)local_5ac);
    if (bVar3) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case SimdLaneOp:
    Consume((Token *)&lane_idx,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)&lane_idx);
    RVar5 = ParseNat(this,&local_1398);
    bVar3 = Failed(RVar5);
    uVar2 = loc.field_1._8_8_;
    if (bVar3) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_2e0 = 1;
    }
    else {
      this_01 = (SimdLaneOpExpr *)operator_new(0x48);
      OVar6 = Token::opcode((Token *)&lane_idx);
      SimdLaneOpExpr::SimdLaneOpExpr(this_01,OVar6,local_1398,(Location *)auStack_40);
      std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
                ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)uVar2,(pointer)this_01)
      ;
      local_2e0 = 2;
    }
    Token::~Token((Token *)&lane_idx);
    goto joined_r0x016e050b;
  case SimdShuffleOp:
    pTVar1 = (Token *)((long)&const__1.field_2 + 8);
    Consume(pTVar1,this);
    ErrorUnlessOpcodeEnabled(this,pTVar1);
    Const::Const((Const *)local_1428);
    RVar5 = ParseSimdConst(this,(Const *)local_1428,I32,0x10);
    bVar3 = Failed(RVar5);
    uVar2 = loc.field_1._8_8_;
    if (bVar3) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_2e0 = 1;
    }
    else {
      this_02 = (SimdShuffleOpExpr *)operator_new(0x50);
      OVar6 = Token::opcode((Token *)((long)&const__1.field_2 + 8));
      val.v[2] = const__1.field_2._0_4_;
      val.v[3] = const__1.field_2._4_4_;
      val.v[0] = const__1.type;
      val.v[1] = const__1._36_4_;
      SimdShuffleOpExpr::SimdShuffleOpExpr(this_02,OVar6,val,(Location *)auStack_40);
      std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
                ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)uVar2,(pointer)this_02)
      ;
      local_2e0 = 2;
    }
    Token::~Token((Token *)((long)&const__1.field_2 + 8));
joined_r0x016e050b:
    if (local_2e0 == 1) {
      return (Result)this_local._4_4_;
    }
    break;
  case Store:
    pTVar1 = (Token *)((long)&const_.field_2 + 8);
    Consume(pTVar1,this);
    loc_10.filename.size_ = (size_type)loc.filename.data_;
    loc_10.filename.data_ = (char *)auStack_40;
    loc_10.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename.size_;
    loc_10.field_1._8_8_ = loc.field_1.field_1.offset;
    RVar5 = ParsePlainLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)39>>
                      (this,loc_10,pTVar1,
                       (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)loc.field_1._8_8_
                      );
    bVar3 = Failed(RVar5);
    Token::~Token((Token *)((long)&const_.field_2 + 8));
    if (bVar3) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case TeeLocal:
    Consume(&local_620,this);
    Token::~Token(&local_620);
    local_648 = (char *)auStack_40;
    local_640 = loc.filename.data_;
    local_638 = loc.filename.size_;
    local_630.offset = (size_t)loc.field_1.field_1.offset;
    loc_06.filename.size_ = (size_type)loc.filename.data_;
    loc_06.filename.data_ = (char *)auStack_40;
    loc_06.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename.size_;
    loc_06.field_1._8_8_ = loc.field_1.field_1.offset;
    local_624 = (Enum)ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)43>>
                                (this,loc_06,
                                 (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                 loc.field_1._8_8_);
    bVar3 = Failed((Result)local_624);
    if (bVar3) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case Ternary:
    Consume((Token *)local_1338,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_1338);
    uVar2 = loc.field_1._8_8_;
    pEVar7 = (pointer)operator_new(0x40);
    token_9.field_2._36_4_ = Token::opcode((Token *)local_1338);
    OpcodeExpr<(wabt::ExprType)44>::OpcodeExpr
              ((OpcodeExpr<(wabt::ExprType)44> *)pEVar7,(Opcode)token_9.field_2._36_4_,
               (Location *)auStack_40);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
              ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)uVar2,pEVar7);
    local_2e0 = 2;
    Token::~Token((Token *)local_1338);
    break;
  case Throw:
    Consume(&local_d98,this);
    ErrorUnlessOpcodeEnabled(this,&local_d98);
    Token::~Token(&local_d98);
    loc_15.filename.size_ = (size_type)loc.filename.data_;
    loc_15.filename.data_ = (char *)auStack_40;
    loc_15.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename.size_;
    loc_15.field_1._8_8_ = loc.field_1.field_1.offset;
    RVar5 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)45>>
                      (this,loc_15,
                       (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)loc.field_1._8_8_
                      );
    bVar3 = Failed(RVar5);
    if (bVar3) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case Unary:
    Consume((Token *)local_8c8,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_8c8);
    uVar2 = loc.field_1._8_8_;
    pEVar7 = (pointer)operator_new(0x40);
    local_8cc = (Enum)Token::opcode((Token *)local_8c8);
    OpcodeExpr<(wabt::ExprType)47>::OpcodeExpr
              ((OpcodeExpr<(wabt::ExprType)47> *)pEVar7,(Opcode)local_8cc,(Location *)auStack_40);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
              ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)uVar2,pEVar7);
    local_2e0 = 2;
    Token::~Token((Token *)local_8c8);
    break;
  case Last_Opcode:
    Consume(&local_90,this);
    Token::~Token(&local_90);
    uVar2 = loc.field_1._8_8_;
    pEVar7 = (pointer)operator_new(0x40);
    ExprMixin<(wabt::ExprType)48>::ExprMixin
              ((ExprMixin<(wabt::ExprType)48> *)pEVar7,(Location *)auStack_40);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
              ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)uVar2,pEVar7);
  }
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParsePlainInstr(std::unique_ptr<Expr>* out_expr) {
  WABT_TRACE(ParsePlainInstr);
  Location loc = GetLocation();
  switch (Peek()) {
    case TokenType::Unreachable:
      Consume();
      out_expr->reset(new UnreachableExpr(loc));
      break;

    case TokenType::Nop:
      Consume();
      out_expr->reset(new NopExpr(loc));
      break;

    case TokenType::Drop:
      Consume();
      out_expr->reset(new DropExpr(loc));
      break;

    case TokenType::Select:
      Consume();
      out_expr->reset(new SelectExpr(loc));
      break;

    case TokenType::Br:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<BrExpr>(loc, out_expr));
      break;

    case TokenType::BrIf:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<BrIfExpr>(loc, out_expr));
      break;

    case TokenType::BrTable: {
      Consume();
      auto expr = MakeUnique<BrTableExpr>(loc);
      CHECK_RESULT(ParseVarList(&expr->targets));
      expr->default_target = expr->targets.back();
      expr->targets.pop_back();
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::Return:
      Consume();
      out_expr->reset(new ReturnExpr(loc));
      break;

    case TokenType::Call:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<CallExpr>(loc, out_expr));
      break;

    case TokenType::CallIndirect: {
      Consume();
      auto expr = MakeUnique<CallIndirectExpr>(loc);
      CHECK_RESULT(ParseTypeUseOpt(&expr->decl));
      CHECK_RESULT(ParseUnboundFuncSignature(&expr->decl.sig));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::ReturnCall:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<ReturnCallExpr>(loc, out_expr));
      break;

    case TokenType::ReturnCallIndirect: {
      ErrorUnlessOpcodeEnabled(Consume());
      auto expr = MakeUnique<ReturnCallIndirectExpr>(loc);
      CHECK_RESULT(ParseTypeUseOpt(&expr->decl));
      CHECK_RESULT(ParseUnboundFuncSignature(&expr->decl.sig));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::GetLocal:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<GetLocalExpr>(loc, out_expr));
      break;

    case TokenType::SetLocal:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<SetLocalExpr>(loc, out_expr));
      break;

    case TokenType::TeeLocal:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<TeeLocalExpr>(loc, out_expr));
      break;

    case TokenType::GetGlobal:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<GetGlobalExpr>(loc, out_expr));
      break;

    case TokenType::SetGlobal:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<SetGlobalExpr>(loc, out_expr));
      break;

    case TokenType::Load:
      CHECK_RESULT(
          ParsePlainLoadStoreInstr<LoadExpr>(loc, Consume(), out_expr));
      break;

    case TokenType::Store:
      CHECK_RESULT(
          ParsePlainLoadStoreInstr<StoreExpr>(loc, Consume(), out_expr));
      break;

    case TokenType::Const: {
      Const const_;
      CHECK_RESULT(ParseConst(&const_));
      out_expr->reset(new ConstExpr(const_, loc));
      break;
    }

    case TokenType::Unary: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      out_expr->reset(new UnaryExpr(token.opcode(), loc));
      break;
    }

    case TokenType::Binary:
      out_expr->reset(new BinaryExpr(Consume().opcode(), loc));
      break;

    case TokenType::Compare:
      out_expr->reset(new CompareExpr(Consume().opcode(), loc));
      break;

    case TokenType::Convert: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      out_expr->reset(new ConvertExpr(token.opcode(), loc));
      break;
    }

    case TokenType::MemoryCopy:
      ErrorUnlessOpcodeEnabled(Consume());
      out_expr->reset(new MemoryCopyExpr(loc));
      break;

    case TokenType::MemoryFill:
      ErrorUnlessOpcodeEnabled(Consume());
      out_expr->reset(new MemoryFillExpr(loc));
      break;

    case TokenType::MemoryDrop:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<MemoryDropExpr>(loc, out_expr));
      break;

    case TokenType::MemoryInit:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<MemoryInitExpr>(loc, out_expr));
      break;

    case TokenType::MemorySize:
      Consume();
      out_expr->reset(new MemorySizeExpr(loc));
      break;

    case TokenType::MemoryGrow:
      Consume();
      out_expr->reset(new MemoryGrowExpr(loc));
      break;

    case TokenType::TableCopy:
      ErrorUnlessOpcodeEnabled(Consume());
      out_expr->reset(new TableCopyExpr(loc));
      break;

    case TokenType::TableDrop:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<TableDropExpr>(loc, out_expr));
      break;

    case TokenType::TableInit:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<TableInitExpr>(loc, out_expr));
      break;

    case TokenType::Throw:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<ThrowExpr>(loc, out_expr));
      break;

    case TokenType::Rethrow:
      ErrorUnlessOpcodeEnabled(Consume());
      out_expr->reset(new RethrowExpr(loc));
      break;

    case TokenType::AtomicWake: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      CHECK_RESULT(
          ParsePlainLoadStoreInstr<AtomicWakeExpr>(loc, token, out_expr));
      break;
    }

    case TokenType::AtomicWait: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      CHECK_RESULT(
          ParsePlainLoadStoreInstr<AtomicWaitExpr>(loc, token, out_expr));
      break;
    }

    case TokenType::AtomicLoad: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      CHECK_RESULT(
          ParsePlainLoadStoreInstr<AtomicLoadExpr>(loc, token, out_expr));
      break;
    }

    case TokenType::AtomicStore: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      CHECK_RESULT(
          ParsePlainLoadStoreInstr<AtomicStoreExpr>(loc, token, out_expr));
      break;
    }

    case TokenType::AtomicRmw: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      CHECK_RESULT(
          ParsePlainLoadStoreInstr<AtomicRmwExpr>(loc, token, out_expr));
      break;
    }

    case TokenType::AtomicRmwCmpxchg: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      CHECK_RESULT(
          ParsePlainLoadStoreInstr<AtomicRmwCmpxchgExpr>(loc, token, out_expr));
      break;
    }

    case TokenType::Ternary: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      out_expr->reset(new TernaryExpr(token.opcode(), loc));
      break;
    }

    case TokenType::SimdLaneOp: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      uint64_t lane_idx;
      CHECK_RESULT(ParseNat(&lane_idx));
      out_expr->reset(new SimdLaneOpExpr(token.opcode(), lane_idx, loc));
      break;
    }

    case TokenType::SimdShuffleOp: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      Const const_;
      CHECK_RESULT((ParseSimdConst(&const_, Type::I32, sizeof(v128))));
      out_expr->reset(
          new SimdShuffleOpExpr(token.opcode(), const_.v128_bits, loc));
      break;
    }

    default:
      assert(
          !"ParsePlainInstr should only be called when IsPlainInstr() is true");
      return Result::Error;
  }

  return Result::Ok;
}